

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

int __thiscall jpgd::jpeg_decoder::decode_next_mcu_row(jpeg_decoder *this)

{
  uint8 *puVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = _setjmp((__jmp_buf_tag *)this);
  iVar3 = -1;
  if (iVar2 == 0) {
    if (((this->m_flags & 1) == 0) && (this->m_scan_type - 3U < 2)) {
      puVar1 = this->m_pSample_buf;
      this->m_pSample_buf = this->m_pSample_buf_prev;
      this->m_pSample_buf_prev = puVar1;
      this->m_sample_buf_prev_valid = true;
    }
    if (this->m_progressive_flag == 0) {
      decode_next_row(this);
    }
    else {
      load_next_row(this);
    }
    if (this->m_total_lines_left <= this->m_max_mcu_y_size) {
      find_eoi(this);
    }
    this->m_mcu_lines_left = this->m_max_mcu_y_size;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int jpeg_decoder::decode_next_mcu_row()
	{
		if (::setjmp(m_jmp_state))
			return JPGD_FAILED;

		const bool chroma_y_filtering = ((m_flags & cFlagBoxChromaFiltering) == 0) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2));
		if (chroma_y_filtering)
		{
			std::swap(m_pSample_buf, m_pSample_buf_prev);

			m_sample_buf_prev_valid = true;
		}

		if (m_progressive_flag)
			load_next_row();
		else
			decode_next_row();

		// Find the EOI marker if that was the last row.
		if (m_total_lines_left <= m_max_mcu_y_size)
			find_eoi();

		m_mcu_lines_left = m_max_mcu_y_size;
		return 0;
	}